

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall
FIX::UnsupportedMessageType::UnsupportedMessageType(UnsupportedMessageType *this,string *what)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unsupported Message Type",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,what);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00151408;
  return;
}

Assistant:

UnsupportedMessageType(const std::string &what = "")
      : Exception("Unsupported Message Type", what) {}